

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslTokenStream.h
# Opt level: O2

void __thiscall
glslang::HlslTokenStream::HlslTokenStream(HlslTokenStream *this,HlslScanContext *scanner)

{
  this->_vptr_HlslTokenStream = (_func_int **)&PTR__HlslTokenStream_00a5c3d0;
  (this->token).field_2.string = (TString *)0x0;
  (this->token).loc.column = 0;
  (this->token).loc.name = (TString *)0x0;
  (this->token).loc.string = 0;
  (this->token).loc.line = 0;
  this->scanner = scanner;
  TVector<const_glslang::TVector<glslang::HlslToken>_*>::TVector(&this->tokenStreamStack);
  TVector<int>::TVector(&this->tokenPosition);
  TVector<glslang::HlslToken>::TVector(&this->currentTokenStack);
  this->preTokenStack[0].loc.column = 0;
  this->preTokenStack[0].loc.name = (TString *)0x0;
  this->preTokenStack[0].loc.string = 0;
  this->preTokenStack[0].loc.line = 0;
  this->preTokenStack[1].field_2.string = (TString *)0x0;
  this->preTokenStackSize = 0;
  this->tokenBuffer[0].loc.column = 0;
  this->tokenBuffer[0].loc.name = (TString *)0x0;
  this->tokenBuffer[0].loc.string = 0;
  this->tokenBuffer[0].loc.line = 0;
  this->tokenBuffer[1].field_2.string = (TString *)0x0;
  this->tokenBufferPos = 0;
  this->preTokenStack[0].field_2.string = (TString *)0x0;
  this->preTokenStack[1].loc.name = (TString *)0x0;
  *(undefined8 *)((long)&this->preTokenStack[1].loc.name + 4) = 0;
  this->preTokenStack[1].loc.line = 0;
  this->preTokenStack[1].loc.column = 0;
  this->tokenBuffer[0].field_2.string = (TString *)0x0;
  this->tokenBuffer[1].loc.name = (TString *)0x0;
  *(undefined8 *)((long)&this->tokenBuffer[1].loc.name + 4) = 0;
  this->tokenBuffer[1].loc.line = 0;
  this->tokenBuffer[1].loc.column = 0;
  return;
}

Assistant:

explicit HlslTokenStream(HlslScanContext& scanner)
            : scanner(scanner), preTokenStackSize(0), tokenBufferPos(0) { }